

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

void __thiscall cmdline::parser::check(parser *this,int argc,bool ok)

{
  bool bVar1;
  ostream *poVar2;
  string local_60;
  string local_40;
  
  if (argc != 1 || ok) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"help","");
    bVar1 = exist(this,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) {
      if (ok) {
        return;
      }
      error_abi_cxx11_(&local_60,this);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_60._M_dataplus._M_p,local_60._M_string_length)
      ;
      poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
      usage_abi_cxx11_(&local_40,this);
      std::operator<<(poVar2,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      exit(1);
    }
  }
  usage_abi_cxx11_(&local_60,this);
  std::operator<<((ostream *)&std::cerr,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  exit(0);
}

Assistant:

void check(int argc, bool ok) {
        if ((argc == 1 && !ok) || exist("help")) {
            std::cerr << usage();
            exit(0);
        }

        if (!ok) {
            std::cerr << error() << std::endl << usage();
            exit(1);
        }
    }